

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O2

QByteArray *
qEncodeHmacMd5(QByteArray *__return_storage_ptr__,QByteArray *key,QByteArrayView message)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  storage_type *psVar4;
  qsizetype qVar5;
  Data *pDVar6;
  char *pcVar7;
  ulong uVar8;
  int i;
  ulong uVar9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QArrayDataPointer<char> local_98;
  QArrayDataPointer<char> local_78;
  QArrayDataPointer<char> local_58;
  QCryptographicHash hash;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  _hash = &DAT_aaaaaaaaaaaaaaaa;
  QCryptographicHash::QCryptographicHash(&hash,Md5);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)&local_58,0x40,'6');
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)&local_78,0x40,'\\');
  QCryptographicHash::reset();
  psVar4 = (storage_type *)(key->d).size;
  if ((storage_type *)0x40 < psVar4) {
    QVar10.m_data = psVar4;
    QVar10.m_size = (qsizetype)&hash;
    QCryptographicHash::addData(QVar10);
    QCryptographicHash::result();
    pDVar6 = (key->d).d;
    pcVar7 = (key->d).ptr;
    (key->d).d = local_98.d;
    (key->d).ptr = local_98.ptr;
    qVar5 = (key->d).size;
    (key->d).size = local_98.size;
    local_98.d = pDVar6;
    local_98.ptr = pcVar7;
    local_98.size = qVar5;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
  }
  QByteArray::leftJustified((longlong)&local_98,(char)key,true);
  pDVar6 = (key->d).d;
  pcVar7 = (key->d).ptr;
  (key->d).d = local_98.d;
  (key->d).ptr = local_98.ptr;
  qVar5 = (key->d).size;
  (key->d).size = local_98.size;
  local_98.d = pDVar6;
  local_98.ptr = pcVar7;
  local_98.size = qVar5;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
  for (uVar9 = 0; uVar8 = (key->d).size, uVar9 < uVar8; uVar9 = uVar9 + 1) {
    pcVar7 = QByteArray::data(key);
    bVar1 = pcVar7[uVar9];
    pcVar7 = QByteArray::data((QByteArray *)&local_58);
    bVar2 = pcVar7[uVar9];
    pcVar7 = QByteArray::data((QByteArray *)&local_58);
    pcVar7[uVar9] = bVar1 ^ bVar2;
  }
  for (uVar9 = 0; uVar9 < uVar8; uVar9 = uVar9 + 1) {
    pcVar7 = QByteArray::data(key);
    bVar1 = pcVar7[uVar9];
    pcVar7 = QByteArray::data((QByteArray *)&local_78);
    bVar2 = pcVar7[uVar9];
    pcVar7 = QByteArray::data((QByteArray *)&local_78);
    pcVar7[uVar9] = bVar1 ^ bVar2;
    uVar8 = (key->d).size;
  }
  QByteArray::append((QByteArray *)&local_58,message);
  QCryptographicHash::reset();
  QVar11.m_data = (storage_type *)local_58.size;
  QVar11.m_size = (qsizetype)&hash;
  QCryptographicHash::addData(QVar11);
  QVar10 = (QByteArrayView)QCryptographicHash::resultView();
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QByteArray::append((QByteArray *)&local_78,QVar10);
  QCryptographicHash::reset();
  QVar12.m_data = (storage_type *)local_78.size;
  QVar12.m_size = (qsizetype)&hash;
  QCryptographicHash::addData(QVar12);
  QCryptographicHash::result();
  pDVar6 = (__return_storage_ptr__->d).d;
  pcVar7 = (__return_storage_ptr__->d).ptr;
  (__return_storage_ptr__->d).d = local_98.d;
  (__return_storage_ptr__->d).ptr = local_98.ptr;
  qVar5 = (__return_storage_ptr__->d).size;
  (__return_storage_ptr__->d).size = local_98.size;
  local_98.d = pDVar6;
  local_98.ptr = pcVar7;
  local_98.size = qVar5;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  QCryptographicHash::~QCryptographicHash(&hash);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray qEncodeHmacMd5(QByteArray &key, QByteArrayView message)
{
    Q_ASSERT_X(!(message.isEmpty()),"qEncodeHmacMd5", "Empty message check");
    Q_ASSERT_X(!(key.isEmpty()),"qEncodeHmacMd5", "Empty key check");

    QCryptographicHash hash(QCryptographicHash::Md5);

    QByteArray iKeyPad(blockSize, 0x36);
    QByteArray oKeyPad(blockSize, 0x5c);

    hash.reset();
    // Adjust the key length to blockSize

    if (blockSize < key.size()) {
        hash.addData(key);
        key = hash.result(); //MD5 will always return 16 bytes length output
    }

    //Key will be <= 16 or 20 bytes as hash function (MD5 or SHA hash algorithms)
    //key size can be max of Block size only
    key = key.leftJustified(blockSize,0,true);

    //iKeyPad, oKeyPad and key are all of same size "blockSize"

    //xor of iKeyPad with Key and store the result into iKeyPad
    for(int i = 0; i<key.size();i++) {
        iKeyPad[i] = key[i]^iKeyPad[i];
    }

    //xor of oKeyPad with Key and store the result into oKeyPad
    for(int i = 0; i<key.size();i++) {
        oKeyPad[i] = key[i]^oKeyPad[i];
    }

    iKeyPad.append(message); // (K0 xor ipad) || text

    hash.reset();
    hash.addData(iKeyPad);
    QByteArrayView hMsg = hash.resultView();
                    //Digest gen after pass-1: H((K0 xor ipad)||text)

    QByteArray hmacDigest;
    oKeyPad.append(hMsg);
    hash.reset();
    hash.addData(oKeyPad);
    hmacDigest = hash.result();
                    // H((K0 xor opad )|| H((K0 xor ipad) || text))

    /*hmacDigest should not be less than half the length of the HMAC output
      (to match the birthday attack bound) and not less than 80 bits
      (a suitable lower bound on the number of bits that need to be
      predicted by an attacker).
      Refer RFC 2104 for more details on truncation part */

    /*MD5 hash always returns 16 byte digest only and HMAC-MD5 spec
      (RFC 2104) also says digest length should be 16 bytes*/
    return hmacDigest;
}